

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::getTestCaseName_abi_cxx11_
          (string *__return_storage_ptr__,VaryingLocationAliasingWithMixedTypesTest *this,
          GLuint test_case_index)

{
  pointer ptVar1;
  GLchar *pGVar2;
  size_t sVar3;
  ostream *poVar4;
  char *pcVar5;
  stringstream stream;
  stringstream asStack_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  ptVar1 = (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Stage: ",7);
  pGVar2 = Utils::Shader::GetStageName(ptVar1[test_case_index].m_stage);
  sVar3 = strlen(pGVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pGVar2,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
  pGVar2 = Utils::Type::GetGLSLTypeName(&ptVar1[test_case_index].m_type_gohan);
  if (pGVar2 == (GLchar *)0x0) {
    std::ios::clear((int)(ostream *)local_1a8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar3 = strlen(pGVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pGVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," at ",4);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  pGVar2 = Utils::Type::GetGLSLTypeName(&ptVar1[test_case_index].m_type_goten);
  if (pGVar2 == (GLchar *)0x0) {
    std::ios::clear((int)poVar4 + (int)poVar4->_vptr_basic_ostream[-3]);
  }
  else {
    sVar3 = strlen(pGVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pGVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," at ",4);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,". Direction: ",0xd);
  pcVar5 = "output";
  if ((ulong)ptVar1[test_case_index].m_is_input != 0) {
    pcVar5 = "input";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,pcVar5,6 - (ulong)ptVar1[test_case_index].m_is_input);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string VaryingLocationAliasingWithMixedTypesTest::getTestCaseName(GLuint test_case_index)
{
	std::stringstream stream;
	testCase&		  test_case = m_test_cases[test_case_index];

	stream << "Stage: " << Utils::Shader::GetStageName(test_case.m_stage) << ", "
		   << test_case.m_type_gohan.GetGLSLTypeName() << " at " << test_case.m_component_gohan << ", "
		   << test_case.m_type_goten.GetGLSLTypeName() << " at " << test_case.m_component_goten << ". Direction: ";

	if (true == test_case.m_is_input)
	{
		stream << "input";
	}
	else
	{
		stream << "output";
	}

	return stream.str();
}